

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genDumpFunction_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  size_t sVar1;
  View *pVVar2;
  Attribute *pAVar3;
  ulong uVar4;
  ulong local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string fields;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  offset_abi_cxx11_(&local_290,this,1);
  std::operator+(&local_2d0,"#ifdef DUMP_OUTPUT\n",&local_290);
  std::operator+(&local_350,&local_2d0,"void dumpOutputViews()\n");
  offset_abi_cxx11_(&local_2f0,this,1);
  std::operator+(&local_330,&local_350,&local_2f0);
  std::operator+(&local_310,&local_330,"{\n");
  offset_abi_cxx11_(&local_2b0,this,2);
  std::operator+(&fields,&local_310,&local_2b0);
  std::operator+(__return_storage_ptr__,&fields,"std::ofstream ofs;\n");
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  local_358 = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= local_358) break;
    pVVar2 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_358);
    if (pVVar2->_origin == pVVar2->_destination) {
      offset_abi_cxx11_(&local_230,this,2);
      std::operator+(&local_1d0,&local_230,"ofs.open(\"output/");
      std::operator+(&local_2b0,&local_1d0,this->viewName + local_358);
      std::operator+(&local_2f0,&local_2b0,".tbl\");\n");
      offset_abi_cxx11_(&local_1f0,this,2);
      std::operator+(&local_290,&local_2f0,&local_1f0);
      std::operator+(&local_2d0,&local_290,"ofs << \"");
      sVar1 = std::_Base_bitset<2UL>::_M_do_count(&(pVVar2->_fVars).super__Base_bitset<2UL>);
      std::__cxx11::to_string(&local_250,sVar1);
      std::operator+(&local_350,&local_2d0,&local_250);
      std::operator+(&local_330,&local_350," ");
      std::__cxx11::to_string
                (&local_210,
                 (long)(pVVar2->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pVVar2->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_310,&local_330,&local_210);
      std::operator+(&fields,&local_310,"\\n\";\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&fields);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::string((string *)&fields,"",(allocator *)&local_310);
      for (uVar4 = 0; uVar4 != 100; uVar4 = uVar4 + 1) {
        if (((pVVar2->_fVars).super__Base_bitset<2UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)
        {
          pAVar3 = TreeDecomposition::getAttribute
                             ((this->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,uVar4);
          std::operator+(&local_330," << tuple.",&pAVar3->_name);
          std::operator+(&local_310,&local_330," <<\"|\"");
          std::__cxx11::string::append((string *)&fields);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_330);
        }
      }
      for (uVar4 = 0;
          uVar4 < (ulong)((long)(pVVar2->_aggregates).
                                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pVVar2->_aggregates).
                                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
        std::__cxx11::to_string(&local_350,uVar4);
        std::operator+(&local_330," << tuple.aggregates[",&local_350);
        std::operator+(&local_310,&local_330,"] << \"|\"");
        std::__cxx11::string::append((string *)&fields);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      offset_abi_cxx11_(&local_d0,this,2);
      std::operator+(&local_b0,&local_d0,"for (size_t i=0; i < ");
      std::operator+(&local_90,&local_b0,this->viewName + local_358);
      std::operator+(&local_1b0,&local_90,".size(); ++i)\n");
      offset_abi_cxx11_(&local_f0,this,2);
      std::operator+(&local_70,&local_1b0,&local_f0);
      std::operator+(&local_190,&local_70,"{\n");
      offset_abi_cxx11_(&local_110,this,3);
      std::operator+(&local_50,&local_190,&local_110);
      std::operator+(&local_210,&local_50,this->viewName + local_358);
      std::operator+(&local_250,&local_210,"_tuple& tuple = ");
      std::operator+(&local_1f0,&local_250,this->viewName + local_358);
      std::operator+(&local_230,&local_1f0,"[i];\n");
      offset_abi_cxx11_(&local_130,this,3);
      std::operator+(&local_1d0,&local_230,&local_130);
      std::operator+(&local_2b0,&local_1d0,"ofs ");
      std::operator+(&local_2f0,&local_2b0,&fields);
      std::operator+(&local_290,&local_2f0,"\"\\n\";\n");
      offset_abi_cxx11_(&local_150,this,2);
      std::operator+(&local_2d0,&local_290,&local_150);
      std::operator+(&local_350,&local_2d0,"}\n");
      offset_abi_cxx11_(&local_170,this,2);
      std::operator+(&local_330,&local_350,&local_170);
      std::operator+(&local_310,&local_330,"ofs.close();\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&fields);
    }
    local_358 = local_358 + 1;
  }
  offset_abi_cxx11_(&local_330,this,1);
  std::operator+(&local_310,&local_330,"}\n");
  std::operator+(&fields,&local_310,"#endif\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genDumpFunction()
{
    std::string returnString = "#ifdef DUMP_OUTPUT\n"+
        offset(1)+"void dumpOutputViews()\n"+offset(1)+"{\n"+
        offset(2)+"std::ofstream ofs;\n";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        if (view->_origin != view->_destination)
            continue;

        returnString += offset(2)+"ofs.open(\"output/"+
            viewName[viewID]+".tbl\");\n"+
            offset(2)+"ofs << \""+std::to_string(view->_fVars.count())+" "+
            std::to_string(view->_aggregates.size())+"\\n\";\n";
            
        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += " << tuple."+attr->_name+" <<\"|\"";
            }
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += " << tuple.aggregates["+std::to_string(agg)+"] << \"|\"";

        fields.pop_back();
        fields.pop_back();
        fields.pop_back();
        
        returnString += offset(2)+"for (size_t i=0; i < "+viewName[viewID]+
            ".size(); ++i)\n"+offset(2)+"{\n"+offset(3)+
            viewName[viewID]+"_tuple& tuple = "+viewName[viewID]+"[i];\n"+
            offset(3)+"ofs "+fields+"\"\\n\";\n"+offset(2)+"}\n"+
            offset(2)+"ofs.close();\n";
    }

    returnString += offset(1)+"}\n"+"#endif\n";
    return returnString;
}